

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeClose(Btree *p)

{
  BtShared *pBt_00;
  BtCursor *pBVar1;
  int iVar2;
  BtCursor *pTmp;
  BtCursor *pCur;
  BtShared *pBt;
  Btree *p_local;
  
  pBt_00 = p->pBt;
  sqlite3BtreeEnter(p);
  pBVar1 = pBt_00->pCursor;
  while (pTmp = pBVar1, pTmp != (BtCursor *)0x0) {
    pBVar1 = pTmp->pNext;
    if (pTmp->pBtree == p) {
      sqlite3BtreeCloseCursor(pTmp);
    }
  }
  sqlite3BtreeRollback(p,0,0);
  sqlite3BtreeLeave(p);
  if ((p->sharable == '\0') || (iVar2 = removeFromSharingList(pBt_00), iVar2 != 0)) {
    sqlite3PagerClose(pBt_00->pPager,p->db);
    if ((pBt_00->xFreeSchema != (_func_void_void_ptr *)0x0) && (pBt_00->pSchema != (void *)0x0)) {
      (*pBt_00->xFreeSchema)(pBt_00->pSchema);
    }
    sqlite3DbFree((sqlite3 *)0x0,pBt_00->pSchema);
    freeTempSpace(pBt_00);
    sqlite3_free(pBt_00);
  }
  if (p->pPrev != (Btree *)0x0) {
    p->pPrev->pNext = p->pNext;
  }
  if (p->pNext != (Btree *)0x0) {
    p->pNext->pPrev = p->pPrev;
  }
  sqlite3_free(p);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;
  BtCursor *pCur;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  pCur = pBt->pCursor;
  while( pCur ){
    BtCursor *pTmp = pCur;
    pCur = pCur->pNext;
    if( pTmp->pBtree==p ){
      sqlite3BtreeCloseCursor(pTmp);
    }
  }

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans 
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}